

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode_atom.c
# Opt level: O2

void base64_encode_atom(uchar *data,int n,char *out)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  
  uVar2 = (uint)*data << 0x10;
  if ((n < 2) || (uVar2 = uVar2 | (uint)data[1] << 8, n == 2)) {
    bVar1 = false;
  }
  else {
    uVar2 = uVar2 | data[2];
    bVar1 = true;
  }
  *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 >> 0x12];
  out[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 >> 0xc & 0x3f];
  cVar3 = '=';
  cVar4 = '=';
  if (1 < n) {
    cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 >> 6 & 0x3f];
  }
  out[2] = cVar4;
  if (bVar1) {
    cVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 & 0x3f];
  }
  out[3] = cVar3;
  return;
}

Assistant:

void base64_encode_atom(const unsigned char *data, int n, char *out)
{
    static const char base64_chars[] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    unsigned word;

    word = data[0] << 16;
    if (n > 1)
        word |= data[1] << 8;
    if (n > 2)
        word |= data[2];
    out[0] = base64_chars[(word >> 18) & 0x3F];
    out[1] = base64_chars[(word >> 12) & 0x3F];
    if (n > 1)
        out[2] = base64_chars[(word >> 6) & 0x3F];
    else
        out[2] = '=';
    if (n > 2)
        out[3] = base64_chars[word & 0x3F];
    else
        out[3] = '=';
}